

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

pool_ptr<soul::AST::Processor> __thiscall
soul::StructuralParser::parseTopLevelItem<soul::AST::Processor>
          (StructuralParser *this,CodeLocation *processorKeywordLocation,ModuleBase *parentModule)

{
  bool bVar1;
  Processor *o;
  Namespace *pNVar2;
  ModuleBase *in_RCX;
  anon_class_8_1_e78d0acc local_148;
  undefined1 local_140 [24];
  CodeLocation local_128;
  Ptr local_110;
  UTF8Reader local_108;
  Identifier local_100;
  pool_ptr<soul::AST::ModuleBase> oldModule;
  ScopedScope scope;
  pool_ptr<soul::AST::Namespace> newNamespace;
  Processor *newModule;
  pool_ptr<soul::AST::Namespace> local_98;
  pool_ptr<soul::AST::Namespace> parentNamespace;
  pool_ref<soul::AST::NamespaceAliasDeclaration> local_88;
  NamespaceAliasDeclaration *local_80;
  NamespaceAliasDeclaration *alias;
  undefined1 local_70 [8];
  pool_ptr<soul::AST::Expression> specialisationArgs;
  QualifiedIdentifier *identifier;
  Identifier local_48;
  Identifier name;
  Context context;
  ModuleBase *parentModule_local;
  CodeLocation *processorKeywordLocation_local;
  StructuralParser *this_local;
  
  getContext((Context *)&name,(StructuralParser *)processorKeywordLocation);
  local_48 = parseIdentifierWithMaxLength((StructuralParser *)processorKeywordLocation,0x80);
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)processorKeywordLocation,(TokenType)0x4aecb7);
  if (bVar1) {
    specialisationArgs.object =
         &parseQualifiedIdentifier((StructuralParser *)processorKeywordLocation)->super_Expression;
    parseSpecialisationArgs((StructuralParser *)local_70);
    alias = (NamespaceAliasDeclaration *)0x4ad30b;
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>
              ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                *)processorKeywordLocation,(TokenType)0x4ad30b);
    local_80 = allocate<soul::AST::NamespaceAliasDeclaration,soul::AST::Context&,soul::Identifier&,soul::AST::QualifiedIdentifier&,soul::pool_ptr<soul::AST::Expression>&>
                         ((StructuralParser *)processorKeywordLocation,(Context *)&name,
                          &stack0xffffffffffffffb8,(QualifiedIdentifier *)specialisationArgs.object,
                          (pool_ptr<soul::AST::Expression> *)local_70);
    pool_ref<soul::AST::NamespaceAliasDeclaration>::
    pool_ref<soul::AST::NamespaceAliasDeclaration,void>(&local_88,local_80);
    std::
    vector<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_>_>
    ::push_back(&in_RCX->namespaceAliases,&local_88);
    pool_ref<soul::AST::NamespaceAliasDeclaration>::~pool_ref(&local_88);
    pool_ptr<soul::AST::Processor>::pool_ptr((pool_ptr<soul::AST::Processor> *)this);
    parentNamespace.object._4_4_ = 1;
    pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)local_70);
    goto LAB_00369562;
  }
  cast<soul::AST::Namespace,soul::AST::ModuleBase>((soul *)&local_98,in_RCX);
  bVar1 = pool_ptr<soul::AST::Namespace>::operator==(&local_98,(void *)0x0);
  if (bVar1) {
    Errors::namespaceMustBeInsideNamespace<>();
    AST::Context::throwError((Context *)&name,(CompileMessage *)&newModule,false);
  }
  o = allocate<soul::AST::Processor,soul::CodeLocation&,soul::AST::Context&,soul::Identifier&>
                ((StructuralParser *)processorKeywordLocation,(CodeLocation *)parentModule,
                 (Context *)&name,&stack0xffffffffffffffb8);
  pNVar2 = pool_ptr<soul::AST::Namespace>::operator->(&local_98);
  pool_ref<soul::AST::ModuleBase>::pool_ref<soul::AST::Processor,void>
            ((pool_ref<soul::AST::ModuleBase> *)&newNamespace,o);
  std::
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  ::push_back(&pNVar2->subModules,(value_type *)&newNamespace);
  pool_ref<soul::AST::ModuleBase>::~pool_ref((pool_ref<soul::AST::ModuleBase> *)&newNamespace);
  cast<soul::AST::Namespace,soul::AST::Processor>((soul *)&scope.oldScope,o);
  ScopedScope::ScopedScope
            ((ScopedScope *)&oldModule,(StructuralParser *)processorKeywordLocation,
             &(o->super_ProcessorBase).super_ModuleBase.super_Scope);
  local_100.name = (string *)processorKeywordLocation[8].sourceCode.object;
  pool_ptr<soul::AST::ModuleBase>::pool_ptr<soul::AST::Processor,void>
            ((pool_ptr<soul::AST::ModuleBase> *)&local_108,o);
  processorKeywordLocation[8].sourceCode.object = (SourceCodeText *)local_108.data;
  pool_ptr<soul::AST::ModuleBase>::~pool_ptr((pool_ptr<soul::AST::ModuleBase> *)&local_108);
  bVar1 = pool_ptr<soul::AST::Namespace>::operator!=
                    ((pool_ptr<soul::AST::Namespace> *)&scope.oldScope,(void *)0x0);
  if (bVar1) {
    local_110.object = (SourceCodeText *)0x4ae19b;
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>
                      ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                        *)processorKeywordLocation,(TokenType)0x4ae19b);
    if (!bVar1) goto LAB_00369494;
    local_128.sourceCode.object = (SourceCodeText *)0x0;
    local_128.location.data = (char *)0x0;
    CodeLocation::CodeLocation(&local_128);
    pNVar2 = pool_ptr<soul::AST::Namespace>::operator->
                       ((pool_ptr<soul::AST::Namespace> *)&scope.oldScope);
    CodeLocation::operator=(&(pNVar2->super_ModuleBase).processorKeywordLocation,&local_128);
    CodeLocation::~CodeLocation(&local_128);
    CodeLocation::CodeLocation((CodeLocation *)local_140,(CodeLocation *)parentModule);
    pool_ptr<soul::AST::Namespace>::operator*((pool_ptr<soul::AST::Namespace> *)&scope.oldScope);
    parseTopLevelItem<soul::AST::Processor>
              ((StructuralParser *)(local_140 + 0x10),processorKeywordLocation,
               (ModuleBase *)local_140);
    pool_ptr<soul::AST::Processor>::~pool_ptr((pool_ptr<soul::AST::Processor> *)(local_140 + 0x10));
    CodeLocation::~CodeLocation((CodeLocation *)local_140);
  }
  else {
LAB_00369494:
    parseTopLevelDeclContent((StructuralParser *)processorKeywordLocation);
  }
  processorKeywordLocation[8].sourceCode.object = (SourceCodeText *)local_100.name;
  local_148.newModule = o;
  std::
  function<soul::AST::ModuleBase&(soul::AST::Allocator&,soul::AST::Namespace&,std::__cxx11::string_const&)>
  ::operator=((function<soul::AST::ModuleBase&(soul::AST::Allocator&,soul::AST::Namespace&,std::__cxx11::string_const&)>
               *)&(o->super_ProcessorBase).super_ModuleBase.createClone,&local_148);
  pool_ptr<soul::AST::Processor>::pool_ptr<soul::AST::Processor,void>
            ((pool_ptr<soul::AST::Processor> *)this,o);
  parentNamespace.object._4_4_ = 1;
  pool_ptr<soul::AST::ModuleBase>::~pool_ptr((pool_ptr<soul::AST::ModuleBase> *)&local_100);
  ScopedScope::~ScopedScope((ScopedScope *)&oldModule);
  pool_ptr<soul::AST::Namespace>::~pool_ptr((pool_ptr<soul::AST::Namespace> *)&scope.oldScope);
  pool_ptr<soul::AST::Namespace>::~pool_ptr(&local_98);
LAB_00369562:
  AST::Context::~Context((Context *)&name);
  return (pool_ptr<soul::AST::Processor>)(Processor *)this;
}

Assistant:

pool_ptr<ModuleType> parseTopLevelItem (CodeLocation processorKeywordLocation, AST::ModuleBase& parentModule)
    {
        auto context = getContext();
        auto name = parseIdentifierWithMaxLength (AST::maxIdentifierLength);

        if (matchIf (Operator::assign))
        {
            auto& identifier = parseQualifiedIdentifier();
            auto specialisationArgs = parseSpecialisationArgs();
            expect (Operator::semicolon);
            auto& alias = allocate<AST::NamespaceAliasDeclaration> (context, name, identifier, specialisationArgs);
            parentModule.namespaceAliases.push_back (alias);
            return {};
        }

        auto parentNamespace = cast<AST::Namespace> (parentModule);

        if (parentNamespace == nullptr)
            context.throwError (Errors::namespaceMustBeInsideNamespace());

        auto& newModule = allocate<ModuleType> (processorKeywordLocation, context, name);
        parentNamespace->subModules.push_back (newModule);

        auto newNamespace = cast<AST::Namespace> (newModule);
        ScopedScope scope (*this, newModule);
        auto oldModule = module;
        module = newModule;

        if (newNamespace != nullptr && matchIf (Operator::doubleColon))
        {
            newNamespace->processorKeywordLocation = {};
            parseTopLevelItem<ModuleType> (processorKeywordLocation, *newNamespace);
        }
        else
        {
            parseTopLevelDeclContent();
        }

        module = oldModule;

        newModule.createClone = [&newModule] (AST::Allocator& a, AST::Namespace& parentNS, const std::string& newName) -> AST::ModuleBase&
        {
            return cloneModuleWithNewName (a, parentNS, newModule, newName);
        };

        return newModule;
    }